

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManTruthQuit(void)

{
  uint uVar1;
  int iVar2;
  
  if (s_vTtMem != (Vec_Mem_t *)0x0) {
    uVar1 = Vec_MemEntryNum(s_vTtMem);
    iVar2 = Vec_MemEntryNum(s_vTtMem);
    printf("TT = %d (%.2f %%)\n",((double)iVar2 * 100.0) / (double)s_nCalls,(ulong)uVar1);
    Vec_MemHashFree(s_vTtMem);
    Vec_MemFree(s_vTtMem);
    s_vTtMem = (Vec_Mem_t *)0x0;
    s_nCalls = 0;
  }
  return;
}

Assistant:

void Mf_ManTruthQuit()
{
    if ( s_vTtMem == NULL )
        return;
    printf( "TT = %d (%.2f %%)\n", Vec_MemEntryNum(s_vTtMem), 100.0 * Vec_MemEntryNum(s_vTtMem) / s_nCalls );
    Vec_MemHashFree( s_vTtMem );
    Vec_MemFree( s_vTtMem );
    s_vTtMem = NULL;
    s_nCalls = 0;
}